

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
absl::lts_20240722::container_internal::
btree_node<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
::rebalance_right_to_left
          (btree_node<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
           *this,field_type to_move,
          btree_node<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
          *right,allocator_type *alloc)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  btree_node<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  *pbVar5;
  btree_node<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  bVar6;
  uint uVar7;
  field_type fVar8;
  field_type fVar9;
  
  if ((((ulong)this & 7) != 0) || (((ulong)right & 7) != 0)) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                  ,0x1fe,
                  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *, unsigned int, unsigned char, int, absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 61, 62>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *, unsigned int, unsigned char, int, absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 61, 62>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 0UL, Char = const char]"
                 );
  }
  if (*(long *)this != *(long *)right) {
    __assert_fail("parent() == right->parent()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x738,
                  "void absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_right_to_left(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
                 );
  }
  if ((byte)this[8] + 1 == (uint)(byte)right[8]) {
    bVar1 = count(right);
    bVar2 = count(this);
    if (bVar1 < bVar2) {
      __assert_fail("right->count() >= count()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                    ,0x73a,
                    "void absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_right_to_left(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
                   );
    }
    if (to_move != '\0') {
      bVar1 = count(right);
      if (bVar1 < to_move) {
        __assert_fail("to_move <= right->count()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                      ,0x73c,
                      "void absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_right_to_left(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
                     );
      }
      transfer(this,(ulong)(byte)this[10],(ulong)(byte)this[8],
               *(btree_node<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                 **)this,alloc);
      bVar6 = this[10];
      bVar1 = start(right);
      transfer_n(this,(ulong)(to_move - 1),(ulong)(byte)bVar6 + 1,(ulong)bVar1,right,alloc);
      pbVar5 = *(btree_node<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                 **)this;
      bVar6 = this[8];
      bVar1 = start(right);
      transfer(pbVar5,(ulong)(byte)bVar6,(ulong)(((uint)bVar1 + (uint)to_move) - 1),right,alloc);
      bVar1 = count(right);
      uVar7 = (uint)to_move;
      bVar2 = start(right);
      bVar3 = start(right);
      transfer_n(right,(long)(int)(bVar1 - uVar7),(ulong)bVar2,(ulong)(bVar3 + uVar7),right,alloc);
      if (this[0xb] ==
          (btree_node<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
           )0x0) {
        fVar8 = '\0';
        do {
          fVar9 = fVar8 + '\x01';
          bVar6 = this[10];
          pbVar5 = child(right,fVar8);
          init_child(this,(char)bVar6 + fVar9,pbVar5);
          fVar8 = fVar9;
        } while (to_move != fVar9);
        bVar1 = start(right);
        uVar4 = (uint)bVar1;
        if ((int)(uint)bVar1 <= (int)((byte)right[10] - uVar7)) {
          do {
            bVar6 = right[0xb];
            if (right[0xb] ==
                (btree_node<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                 )0x0) {
              bVar6 = (btree_node<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                       )0x3d;
            }
            if ((uint)(byte)bVar6 < uVar4 + uVar7) {
              __assert_fail("i + to_move <= right->max_count()",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                            ,0x751,
                            "void absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_right_to_left(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
                           );
            }
            fVar8 = (field_type)(uVar4 + uVar7);
            pbVar5 = child(right,fVar8);
            init_child(right,bVar1,pbVar5);
            mutable_child(right,fVar8);
            bVar1 = bVar1 + 1;
            uVar4 = (uint)bVar1;
          } while ((int)uVar4 <= (int)((byte)right[10] - uVar7));
        }
      }
      this[10] = (btree_node<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                  )((char)this[10] + to_move);
      right[10] = (btree_node<absl::lts_20240722::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                   )((char)right[10] - to_move);
      return;
    }
    __assert_fail("to_move >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                  ,0x73b,
                  "void absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_right_to_left(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
                 );
  }
  __assert_fail("position() + 1 == right->position()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                ,0x739,
                "void absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_right_to_left(field_type, btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
               );
}

Assistant:

void btree_node<P>::rebalance_right_to_left(field_type to_move,
                                            btree_node *right,
                                            allocator_type *alloc) {
  assert(parent() == right->parent());
  assert(position() + 1 == right->position());
  assert(right->count() >= count());
  assert(to_move >= 1);
  assert(to_move <= right->count());

  // 1) Move the delimiting value in the parent to the left node.
  transfer(finish(), position(), parent(), alloc);

  // 2) Move the (to_move - 1) values from the right node to the left node.
  transfer_n(to_move - 1, finish() + 1, right->start(), right, alloc);

  // 3) Move the new delimiting value to the parent from the right node.
  parent()->transfer(position(), right->start() + to_move - 1, right, alloc);

  // 4) Shift the values in the right node to their correct positions.
  right->transfer_n(right->count() - to_move, right->start(),
                    right->start() + to_move, right, alloc);

  if (is_internal()) {
    // Move the child pointers from the right to the left node.
    for (field_type i = 0; i < to_move; ++i) {
      init_child(finish() + i + 1, right->child(i));
    }
    for (field_type i = right->start(); i <= right->finish() - to_move; ++i) {
      assert(i + to_move <= right->max_count());
      right->init_child(i, right->child(i + to_move));
      right->clear_child(i + to_move);
    }
  }

  // Fixup `finish` on the left and right nodes.
  set_finish(finish() + to_move);
  right->set_finish(right->finish() - to_move);
}